

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkGraphicsPipelineCreateInfo *pipe,SubpassMeta *subpass_meta,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  VkVertexInputAttributeDescription *pVVar4;
  VkVertexInputBindingDescription *pVVar5;
  char cVar6;
  bool bVar7;
  ulong uVar8;
  VkPipelineVertexInputStateCreateInfo *pVVar9;
  VkPipelineColorBlendStateCreateInfo *pVVar10;
  VkPipelineViewportStateCreateInfo *pVVar11;
  byte bVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  VkPipelineColorBlendAttachmentState *pVVar16;
  uint uVar17;
  GlobalStateInfo GVar18;
  Value nexts;
  Value tess;
  VkPipelineColorBlendAttachmentState blank_attachment;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  Value sm;
  Value bindings;
  Value p;
  Value attrib;
  DynamicStateInfo dynamic_info;
  Value att;
  StringRefType local_140;
  StringRefType local_130;
  StringRefType local_120;
  StringRefType local_110;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  p.data_.n = (Number)0x0;
  p.data_.s.str = (Ch *)0x3000000000000;
  dynamic_info._0_8_ = ZEXT48(pipe->flags);
  blank_attachment.dstColorBlendFactor = 0x150be7;
  blank_attachment.colorBlendOp = 0x4050000;
  blank_attachment.blendEnable = 5;
  blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  dynamic_info._8_8_ = (ulong)(-1 < (int)pipe->flags) << 0x35 | 0x1d6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&blank_attachment,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&dynamic_info,alloc);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&blank_attachment,(uint64_t)pipe->basePipelineHandle,alloc);
  dynamic_info.viewport = true;
  dynamic_info.scissor_count = true;
  dynamic_info.viewport_count = true;
  dynamic_info.cull_mode = false;
  dynamic_info.front_face = false;
  dynamic_info.depth_test_enable = false;
  dynamic_info.depth_write_enable = true;
  dynamic_info.depth_compare_op = true;
  dynamic_info.stencil_compare = true;
  dynamic_info.stencil_reference = false;
  dynamic_info.stencil_write_mask = false;
  dynamic_info.depth_bounds = false;
  dynamic_info.depth_bias = false;
  dynamic_info.line_width = false;
  dynamic_info.blend_constants = false;
  dynamic_info.scissor = false;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&dynamic_info,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&blank_attachment,alloc);
  local_40.s = "basePipelineIndex";
  local_40.length = 0x11;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(&p,&local_40,pipe->basePipelineIndex,alloc);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&blank_attachment,(uint64_t)pipe->layout,alloc);
  dynamic_info.viewport = true;
  dynamic_info.scissor_count = true;
  dynamic_info.viewport_count = true;
  dynamic_info.cull_mode = false;
  dynamic_info.front_face = false;
  dynamic_info.depth_test_enable = false;
  dynamic_info.depth_write_enable = true;
  dynamic_info.depth_compare_op = true;
  dynamic_info.stencil_compare = true;
  dynamic_info.stencil_reference = false;
  dynamic_info.stencil_write_mask = false;
  dynamic_info.depth_bounds = false;
  dynamic_info.depth_bias = false;
  dynamic_info.line_width = false;
  dynamic_info.blend_constants = false;
  dynamic_info.scissor = false;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&dynamic_info,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&blank_attachment,alloc);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&blank_attachment,(uint64_t)pipe->renderPass,alloc);
  dynamic_info.viewport = true;
  dynamic_info.scissor_count = true;
  dynamic_info.viewport_count = true;
  dynamic_info.cull_mode = false;
  dynamic_info.front_face = false;
  dynamic_info.depth_test_enable = false;
  dynamic_info.depth_write_enable = true;
  dynamic_info.depth_compare_op = true;
  dynamic_info.stencil_compare = true;
  dynamic_info.stencil_reference = false;
  dynamic_info.stencil_write_mask = false;
  dynamic_info.depth_bounds = false;
  dynamic_info.depth_bias = false;
  dynamic_info.line_width = false;
  dynamic_info.blend_constants = false;
  dynamic_info.scissor = false;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&dynamic_info,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&blank_attachment,alloc);
  dynamic_info._0_8_ = ZEXT48(pipe->subpass);
  blank_attachment.dstColorBlendFactor = 0x151326;
  blank_attachment.colorBlendOp = 0x4050000;
  blank_attachment.blendEnable = 7;
  blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  dynamic_info._8_8_ = (ulong)(-1 < (int)pipe->subpass) << 0x35 | 0x1d6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&blank_attachment,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&dynamic_info,alloc);
  dynamic_info.color_blend_advanced = false;
  dynamic_info.provoking_vertex_mode = false;
  dynamic_info.line_rasterization_mode = false;
  dynamic_info.line_stipple_enable = false;
  dynamic_info.depth_clip_negative_one_to_one = false;
  dynamic_info.viewport_w_scaling_enable = false;
  dynamic_info.viewport_swizzle = false;
  dynamic_info.coverage_to_color_enable = false;
  dynamic_info.coverage_to_color_location = false;
  dynamic_info.coverage_modulation_mode = false;
  dynamic_info.coverage_modulation_table_enable = false;
  dynamic_info.coverage_modulation_table = false;
  dynamic_info.shading_rate_image_enable = false;
  dynamic_info.representative_fragment_test_enable = false;
  dynamic_info.coverage_reduction_mode = false;
  dynamic_info.depth_clamp_range = false;
  dynamic_info.tessellation_domain_origin = false;
  dynamic_info.depth_clamp_enable = false;
  dynamic_info.polygon_mode = false;
  dynamic_info.rasterization_samples = false;
  dynamic_info.sample_mask = false;
  dynamic_info.alpha_to_coverage_enable = false;
  dynamic_info.alpha_to_one_enable = false;
  dynamic_info.logic_op_enable = false;
  dynamic_info.color_blend_enable = false;
  dynamic_info.color_blend_equation = false;
  dynamic_info.color_write_mask = false;
  dynamic_info.rasterization_stream = false;
  dynamic_info.conservative_rasterization_mode = false;
  dynamic_info.extra_primitive_overestimation_size = false;
  dynamic_info.depth_clip_enable = false;
  dynamic_info.sample_locations_enable = false;
  dynamic_info.depth_bounds_test_enable = false;
  dynamic_info.stencil_test_enable = false;
  dynamic_info.stencil_op = false;
  dynamic_info.vertex_input = false;
  dynamic_info.vertex_input_binding_stride = false;
  dynamic_info.patch_control_points = false;
  dynamic_info.rasterizer_discard_enable = false;
  dynamic_info.primitive_restart_enable = false;
  dynamic_info.logic_op = false;
  dynamic_info.color_write_enable = false;
  dynamic_info.depth_bias_enable = false;
  dynamic_info.discard_rectangle = false;
  dynamic_info.discard_rectangle_mode = false;
  dynamic_info.fragment_shading_rate = false;
  dynamic_info.sample_locations = false;
  dynamic_info.line_stipple = false;
  dynamic_info.stencil_compare = false;
  dynamic_info.stencil_reference = false;
  dynamic_info.stencil_write_mask = false;
  dynamic_info.depth_bounds = false;
  dynamic_info.depth_bias = false;
  dynamic_info.line_width = false;
  dynamic_info.blend_constants = false;
  dynamic_info.scissor = false;
  dynamic_info.viewport = false;
  dynamic_info.scissor_count = false;
  dynamic_info.viewport_count = false;
  dynamic_info.cull_mode = false;
  dynamic_info.front_face = false;
  dynamic_info.depth_test_enable = false;
  dynamic_info.depth_write_enable = false;
  dynamic_info.depth_compare_op = false;
  if (pipe->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    Hashing::parse_dynamic_state_info((DynamicStateInfo *)&blank_attachment,pipe->pDynamicState);
    dynamic_info._48_8_ = local_218;
    dynamic_info._56_8_ = uStack_210;
    dynamic_info._32_8_ = local_228;
    dynamic_info._40_8_ = uStack_220;
    dynamic_info._16_8_ = blank_attachment._16_8_;
    dynamic_info._24_8_ = blank_attachment._24_8_;
    dynamic_info._0_8_ = blank_attachment._0_8_;
    dynamic_info._8_8_ = blank_attachment._8_8_;
  }
  GVar18 = Hashing::parse_global_state_info(pipe,&dynamic_info,subpass_meta);
  uVar8 = GVar18._0_8_;
  uVar17 = GVar18._0_4_;
  if ((uVar17 >> 8 & 1) == 0) {
LAB_001060f1:
    if (pipe->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
      nexts.data_.n = (Number)0x0;
      nexts.data_.s.str = (Ch *)0x0;
      json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                (pipe->pDynamicState,alloc,&nexts);
      blank_attachment.dstColorBlendFactor = 0x1511d2;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0xc;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&blank_attachment,&nexts,alloc);
    }
    if ((uVar17 >> 0x18 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      uVar13 = pipe->pMultisampleState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x405000000150be7;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_50.s = "rasterizationSamples";
      local_50.length = 0x14;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkSampleCountFlagBits>
                (&tess,&local_50,pipe->pMultisampleState->rasterizationSamples,alloc);
      uVar13 = pipe->pMultisampleState->sampleShadingEnable;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x4050000001511a9;
      nexts.data_.n = (Number)0x13;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pMultisampleState->minSampleShading;
      nexts.data_.s.str = (Ch *)0x40500000015118d;
      nexts.data_.n = (Number)0x10;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar13 = pipe->pMultisampleState->alphaToOneEnable;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x40500000015117c;
      nexts.data_.n = (Number)0x10;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar13 = pipe->pMultisampleState->alphaToCoverageEnable;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x405000000151166;
      nexts.data_.n = (Number)0x15;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x4000000000000;
      if (pipe->pMultisampleState->pSampleMask != (VkSampleMask *)0x0) {
        uVar13 = pipe->pMultisampleState->rasterizationSamples +
                 (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|
                  VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT);
        if (0x1f < uVar13) {
          uVar15 = 0;
          do {
            uVar1 = pipe->pMultisampleState->pSampleMask[uVar15];
            blank_attachment._0_8_ = ZEXT48(uVar1);
            blank_attachment._8_8_ = (ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&sm,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&blank_attachment,alloc);
            uVar15 = uVar15 + 1;
          } while (uVar13 >> 5 != uVar15);
        }
        blank_attachment.dstColorBlendFactor = 0x15119e;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 10;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&sm,alloc);
      }
      pvVar3 = pipe->pMultisampleState->pNext;
      if (pvVar3 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar7 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&nexts,&dynamic_info);
        if (!bVar7) goto LAB_001085b1;
        blank_attachment.dstColorBlendFactor = 0x150c9d;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x151383;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x10;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&blank_attachment,&tess,alloc);
    }
    if ((uVar8 >> 0x30 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x4000000000000;
      bindings.data_.n = (Number)0x0;
      bindings.data_.s.str = (Ch *)0x4000000000000;
      uVar13 = pipe->pVertexInputState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x405000000150be7;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      pVVar9 = pipe->pVertexInputState;
      if (pVVar9->vertexAttributeDescriptionCount != 0) {
        lVar14 = 0xc;
        uVar15 = 0;
        do {
          pVVar4 = pVVar9->pVertexAttributeDescriptions;
          attrib.data_.n = (Number)0x0;
          attrib.data_.s.str = (Ch *)0x3000000000000;
          uVar13 = *(uint *)((long)pVVar4 + lVar14 + -0xc);
          blank_attachment._0_8_ = ZEXT48(uVar13);
          nexts.data_.s.str = (Ch *)0x405000000150f04;
          nexts.data_.n = (Number)0x8;
          blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&attrib,&nexts,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&blank_attachment,alloc);
          uVar13 = *(uint *)((long)pVVar4 + lVar14 + -8);
          blank_attachment._0_8_ = ZEXT48(uVar13);
          nexts.data_.s.str = (Ch *)0x405000000150b86;
          nexts.data_.n = (Number)0x7;
          blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&attrib,&nexts,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&blank_attachment,alloc);
          uVar13 = *(uint *)((long)&pVVar4->location + lVar14);
          blank_attachment._0_8_ = ZEXT48(uVar13);
          nexts.data_.s.str = (Ch *)0x405000000150bca;
          nexts.data_.n = (Number)0x6;
          blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&attrib,&nexts,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&blank_attachment,alloc);
          local_b0.s = "format";
          local_b0.length = 6;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkFormat>(&attrib,&local_b0,*(VkFormat *)((long)pVVar4 + lVar14 + -4),alloc);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(&sm,&attrib,alloc);
          uVar15 = uVar15 + 1;
          pVVar9 = pipe->pVertexInputState;
          lVar14 = lVar14 + 0x10;
        } while (uVar15 < pVVar9->vertexAttributeDescriptionCount);
      }
      pVVar9 = pipe->pVertexInputState;
      if (pVVar9->vertexBindingDescriptionCount != 0) {
        lVar14 = 8;
        uVar15 = 0;
        do {
          pVVar5 = pVVar9->pVertexBindingDescriptions;
          attrib.data_.n = (Number)0x0;
          attrib.data_.s.str = (Ch *)0x3000000000000;
          uVar13 = *(uint *)((long)pVVar5 + lVar14 + -8);
          blank_attachment._0_8_ = ZEXT48(uVar13);
          nexts.data_.s.str = (Ch *)0x405000000150b86;
          nexts.data_.n = (Number)0x7;
          blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&attrib,&nexts,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&blank_attachment,alloc);
          uVar13 = *(uint *)((long)pVVar5 + lVar14 + -4);
          blank_attachment._0_8_ = ZEXT48(uVar13);
          nexts.data_.s.str = (Ch *)0x405000000150f1e;
          nexts.data_.n = (Number)0x6;
          blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&attrib,&nexts,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&blank_attachment,alloc);
          local_c0.s = "inputRate";
          local_c0.length = 9;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkVertexInputRate>
                    (&attrib,&local_c0,*(VkVertexInputRate *)((long)&pVVar5->binding + lVar14),alloc
                    );
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(&bindings,&attrib,alloc);
          uVar15 = uVar15 + 1;
          pVVar9 = pipe->pVertexInputState;
          lVar14 = lVar14 + 0xc;
        } while (uVar15 < pVVar9->vertexBindingDescriptionCount);
      }
      blank_attachment.dstColorBlendFactor = 0x150f25;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 10;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,&sm,alloc);
      blank_attachment.dstColorBlendFactor = 0x150c94;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 8;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,&bindings,alloc);
      pvVar3 = pipe->pVertexInputState->pNext;
      if (pvVar3 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar7 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&nexts,&dynamic_info);
        if (!bVar7) goto LAB_001085b1;
        blank_attachment.dstColorBlendFactor = 0x150c9d;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x1513a7;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x10;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&blank_attachment,&tess,alloc);
    }
    if ((uVar8 >> 0x38 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      uVar13 = pipe->pRasterizationState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x405000000150be7;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pRasterizationState->depthBiasConstantFactor;
      nexts.data_.s.str = (Ch *)0x405000000151003;
      nexts.data_.n = (Number)0x17;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pRasterizationState->depthBiasSlopeFactor;
      nexts.data_.s.str = (Ch *)0x40500000015101b;
      nexts.data_.n = (Number)0x14;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pRasterizationState->depthBiasClamp;
      nexts.data_.s.str = (Ch *)0x405000000150ff4;
      nexts.data_.n = (Number)0xe;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar13 = pipe->pRasterizationState->depthBiasEnable;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x405000000151052;
      nexts.data_.n = (Number)0xf;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar13 = pipe->pRasterizationState->depthClampEnable;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x405000000151062;
      nexts.data_.n = (Number)0x10;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_60.s = "polygonMode";
      local_60.length = 0xb;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPolygonMode>(&tess,&local_60,pipe->pRasterizationState->polygonMode,alloc);
      uVar13 = pipe->pRasterizationState->rasterizerDiscardEnable;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x40500000015103a;
      nexts.data_.n = (Number)0x17;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_70.s = "frontFace";
      local_70.length = 9;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkFrontFace>(&tess,&local_70,pipe->pRasterizationState->frontFace,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pRasterizationState->lineWidth;
      nexts.data_.s.str = (Ch *)0x405000000151030;
      nexts.data_.n = (Number)0x9;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar13 = pipe->pRasterizationState->cullMode;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x405000000150feb;
      nexts.data_.n = (Number)0x8;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      pvVar3 = pipe->pRasterizationState->pNext;
      if (pvVar3 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar7 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&nexts,&dynamic_info);
        if (!bVar7) goto LAB_001085b1;
        blank_attachment.dstColorBlendFactor = 0x150c9d;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x15132e;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x12;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&blank_attachment,&tess,alloc);
    }
    if (((undefined1  [11])GVar18 & (undefined1  [11])0x1) != (undefined1  [11])0x0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      uVar13 = pipe->pInputAssemblyState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x405000000150be7;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_80.s = "topology";
      local_80.length = 8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPrimitiveTopology>(&tess,&local_80,pipe->pInputAssemblyState->topology,alloc);
      uVar13 = pipe->pInputAssemblyState->primitiveRestartEnable;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x40500000015109c;
      nexts.data_.n = (Number)0x16;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      pvVar3 = pipe->pInputAssemblyState->pNext;
      if (pvVar3 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar7 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&nexts,&dynamic_info);
        if (!bVar7) goto LAB_001085b1;
        blank_attachment.dstColorBlendFactor = 0x150c9d;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x151394;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x12;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&blank_attachment,&tess,alloc);
    }
    if ((uVar8 >> 0x28 & 1) != 0) {
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x3000000000000;
      uVar13 = pipe->pColorBlendState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x405000000150be7;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&sm,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_90.s = "logicOp";
      local_90.length = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkLogicOp>(&sm,&local_90,pipe->pColorBlendState->logicOp,alloc);
      uVar13 = pipe->pColorBlendState->logicOpEnable;
      blank_attachment._0_8_ = ZEXT48(uVar13);
      nexts.data_.s.str = (Ch *)0x405000000151149;
      nexts.data_.n = (Number)0xd;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&sm,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      if ((dynamic_info.color_blend_enable == true) && (dynamic_info.color_write_mask == true)) {
        cVar6 = dynamic_info.color_blend_equation;
      }
      else {
        cVar6 = '\0';
      }
      if (cVar6 == '\0') {
        uVar15 = (ulong)pipe->pColorBlendState->attachmentCount;
        if (uVar15 == 0) {
          bVar7 = true;
        }
        else {
          pVVar16 = pipe->pColorBlendState->pAttachments;
          lVar14 = 0;
          bVar12 = 0;
          do {
            if ((*(int *)((long)&pVVar16->blendEnable + lVar14) != 0) &&
               (((((iVar2 = *(int *)((long)&pVVar16->dstAlphaBlendFactor + lVar14), iVar2 == 10 ||
                   (iVar2 == 0xc)) ||
                  (iVar2 = *(int *)((long)&pVVar16->srcAlphaBlendFactor + lVar14), iVar2 == 10)) ||
                 ((iVar2 == 0xc ||
                  (iVar2 = *(int *)((long)&pVVar16->dstColorBlendFactor + lVar14), iVar2 == 10))))
                || ((iVar2 == 0xc ||
                    ((iVar2 = *(int *)((long)&pVVar16->srcColorBlendFactor + lVar14), iVar2 == 0xc
                     || (iVar2 == 10)))))))) {
              bVar12 = 1;
            }
            lVar14 = lVar14 + 0x20;
          } while (uVar15 << 5 != lVar14);
          bVar7 = (bool)(bVar12 ^ 1);
        }
      }
      else {
        bVar7 = false;
      }
      blank_attachment.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.alphaBlendOp = VK_BLEND_OP_ADD;
      blank_attachment.colorWriteMask = 0;
      blank_attachment.blendEnable = 0;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = VK_BLEND_OP_ADD;
      bindings.data_.n = (Number)0x0;
      bindings.data_.s.str = (Ch *)0x4000000000000;
      pVVar10 = pipe->pColorBlendState;
      lVar14 = 0;
      do {
        nexts.data_.n = (Number)0.0;
        if ((dynamic_info._0_8_ & 0x1000000000000) == 0 && !bVar7) {
          nexts.data_.n = (Number)(double)*(float *)((long)pVVar10->blendConstants + lVar14);
        }
        nexts.data_.s.str = (Ch *)0x216000000000000;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&bindings,&nexts,alloc);
        lVar14 = lVar14 + 4;
      } while (lVar14 != 0x10);
      nexts.data_.s.str = (Ch *)0x405000000151157;
      nexts.data_.n = (Number)0xe;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&sm,&nexts,&bindings,alloc);
      attrib.data_.n = (Number)0x0;
      attrib.data_.s.str = (Ch *)0x4000000000000;
      pVVar10 = pipe->pColorBlendState;
      if (pVVar10->attachmentCount != 0) {
        lVar14 = 0;
        uVar15 = 0;
        do {
          pVVar16 = &blank_attachment;
          if (cVar6 == '\0') {
            pVVar16 = (VkPipelineColorBlendAttachmentState *)
                      ((long)&pVVar10->pAttachments->blendEnable + lVar14);
          }
          att.data_.n = (Number)0x0;
          att.data_.s.str = (Ch *)0x3000000000000;
          local_d0.s = "dstAlphaBlendFactor";
          local_d0.length = 0x13;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendFactor>(&att,&local_d0,pVVar16->dstAlphaBlendFactor,alloc);
          local_e0.s = "srcAlphaBlendFactor";
          local_e0.length = 0x13;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendFactor>(&att,&local_e0,pVVar16->srcAlphaBlendFactor,alloc);
          local_f0.s = "dstColorBlendFactor";
          local_f0.length = 0x13;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendFactor>(&att,&local_f0,pVVar16->dstColorBlendFactor,alloc);
          local_100.s = "srcColorBlendFactor";
          local_100.length = 0x13;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendFactor>(&att,&local_100,pVVar16->srcColorBlendFactor,alloc);
          nexts.data_._4_1_ = '\0';
          nexts.data_._5_1_ = '\0';
          nexts.data_._6_1_ = '\0';
          nexts.data_._7_1_ = '\0';
          nexts.data_._0_4_ = pVVar16->colorWriteMask;
          tess.data_.s.str = (Ch *)0x4050000001510c8;
          tess.data_.n = (Number)0xe;
          nexts.data_.s.str =
               (Ch *)((ulong)(-1 < (int)pVVar16->colorWriteMask) << 0x35 | 0x1d6000000000000);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&att,&tess,&nexts,alloc);
          local_110.s = "alphaBlendOp";
          local_110.length = 0xc;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendOp>(&att,&local_110,pVVar16->alphaBlendOp,alloc);
          local_120.s = "colorBlendOp";
          local_120.length = 0xc;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendOp>(&att,&local_120,pVVar16->colorBlendOp,alloc);
          nexts.data_._4_1_ = '\0';
          nexts.data_._5_1_ = '\0';
          nexts.data_._6_1_ = '\0';
          nexts.data_._7_1_ = '\0';
          nexts.data_._0_4_ = pVVar16->blendEnable;
          tess.data_.s.str = (Ch *)0x4050000001510bc;
          tess.data_.n = (Number)0xb;
          nexts.data_.s.str =
               (Ch *)((ulong)(-1 < (int)pVVar16->blendEnable) << 0x35 | 0x1d6000000000000);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&att,&tess,&nexts,alloc);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(&attrib,&att,alloc);
          uVar15 = uVar15 + 1;
          pVVar10 = pipe->pColorBlendState;
          lVar14 = lVar14 + 0x20;
        } while (uVar15 < pVVar10->attachmentCount);
      }
      nexts.data_.s.str = (Ch *)0x405000000150e71;
      nexts.data_.n = (Number)0xb;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&sm,&nexts,&attrib,alloc);
      pvVar3 = pipe->pColorBlendState->pNext;
      if (pvVar3 != (void *)0x0) {
        tess.data_.n = (Number)0x0;
        tess.data_.s.str = (Ch *)0x0;
        bVar7 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&tess,&dynamic_info);
        if (!bVar7) goto LAB_001085b1;
        nexts.data_.s.str = (Ch *)0x405000000150c9d;
        nexts.data_.n = (Number)0x5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&sm,&nexts,&tess,alloc);
      }
      nexts.data_.s.str = (Ch *)0x405000000151353;
      nexts.data_.n = (Number)0xf;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&p,&nexts,&sm,alloc);
    }
    if ((uVar17 >> 0x10 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      uVar17 = pipe->pViewportState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar17);
      nexts.data_.s.str = (Ch *)0x405000000150be7;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar17) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar17 = pipe->pViewportState->viewportCount;
      blank_attachment._0_8_ = ZEXT48(uVar17);
      nexts.data_.s.str = (Ch *)0x405000000151291;
      nexts.data_.n = (Number)0xd;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar17) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar17 = pipe->pViewportState->scissorCount;
      blank_attachment._0_8_ = ZEXT48(uVar17);
      nexts.data_.s.str = (Ch *)0x40500000015127b;
      nexts.data_.n = (Number)0xc;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar17) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      if (pipe->pViewportState->pViewports != (VkViewport *)0x0) {
        sm.data_.n = (Number)0x0;
        sm.data_.s.str = (Ch *)0x4000000000000;
        pVVar11 = pipe->pViewportState;
        if (pVVar11->viewportCount != 0) {
          lVar14 = 0;
          uVar15 = 0;
          do {
            bindings.data_.n = (Number)0x0;
            bindings.data_.s.str = (Ch *)0x3000000000000;
            blank_attachment._0_8_ = (BADTYPE)*(float *)((long)&pVVar11->pViewports->x + lVar14);
            nexts.data_.s.str = (Ch *)0x40500000015059c;
            nexts.data_.n = (Number)0x1;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            blank_attachment._0_8_ =
                 (BADTYPE)*(float *)((long)&pipe->pViewportState->pViewports->y + lVar14);
            nexts.data_.s.str = (Ch *)0x405000000151b71;
            nexts.data_.n = (Number)0x1;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            blank_attachment._0_8_ =
                 (BADTYPE)*(float *)((long)&pipe->pViewportState->pViewports->width + lVar14);
            nexts.data_.s.str = (Ch *)0x40500000015125c;
            nexts.data_.n = (Number)0x5;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            blank_attachment._0_8_ =
                 (BADTYPE)*(float *)((long)&pipe->pViewportState->pViewports->height + lVar14);
            nexts.data_.s.str = (Ch *)0x405000000151262;
            nexts.data_.n = (Number)0x6;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            blank_attachment._0_8_ =
                 (BADTYPE)*(float *)((long)&pipe->pViewportState->pViewports->minDepth + lVar14);
            nexts.data_.s.str = (Ch *)0x405000000151269;
            nexts.data_.n = (Number)0x8;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            blank_attachment._0_8_ =
                 (BADTYPE)*(float *)((long)&pipe->pViewportState->pViewports->maxDepth + lVar14);
            nexts.data_.s.str = (Ch *)0x405000000151272;
            nexts.data_.n = (Number)0x8;
            blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
            blank_attachment.colorBlendOp = 0x2160000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&sm,&bindings,alloc);
            uVar15 = uVar15 + 1;
            pVVar11 = pipe->pViewportState;
            lVar14 = lVar14 + 0x18;
          } while (uVar15 < pVVar11->viewportCount);
        }
        blank_attachment.dstColorBlendFactor = 0x15129f;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 9;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&sm,alloc);
      }
      if (pipe->pViewportState->pScissors != (VkRect2D *)0x0) {
        sm.data_.n = (Number)0x0;
        sm.data_.s.str = (Ch *)0x4000000000000;
        pVVar11 = pipe->pViewportState;
        if (pVVar11->scissorCount != 0) {
          lVar14 = 0;
          uVar15 = 0;
          do {
            bindings.data_.n = (Number)0x0;
            bindings.data_.s.str = (Ch *)0x3000000000000;
            local_130.s = "x";
            local_130.length = 1;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<int>(&bindings,&local_130,
                             *(int *)((long)&(pVVar11->pScissors->offset).x + lVar14),alloc);
            local_140.s = "y";
            local_140.length = 1;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<int>(&bindings,&local_140,
                             *(int *)((long)&(pipe->pViewportState->pScissors->offset).y + lVar14),
                             alloc);
            uVar17 = *(uint *)((long)&(pipe->pViewportState->pScissors->extent).width + lVar14);
            blank_attachment._0_8_ = ZEXT48(uVar17);
            nexts.data_.s.str = (Ch *)0x40500000015125c;
            nexts.data_.n = (Number)0x5;
            blank_attachment._8_8_ = (ulong)(-1 < (int)uVar17) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            uVar17 = *(uint *)((long)&(pipe->pViewportState->pScissors->extent).height + lVar14);
            blank_attachment._0_8_ = ZEXT48(uVar17);
            nexts.data_.s.str = (Ch *)0x405000000151262;
            nexts.data_.n = (Number)0x6;
            blank_attachment._8_8_ = (ulong)(-1 < (int)uVar17) << 0x35 | 0x1d6000000000000;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&bindings,&nexts,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&sm,&bindings,alloc);
            uVar15 = uVar15 + 1;
            pVVar11 = pipe->pViewportState;
            lVar14 = lVar14 + 0x10;
          } while (uVar15 < pVVar11->scissorCount);
        }
        blank_attachment.dstColorBlendFactor = 0x151288;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 8;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&sm,alloc);
      }
      pvVar3 = pipe->pViewportState->pNext;
      if (pvVar3 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar7 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&nexts,&dynamic_info);
        if (!bVar7) goto LAB_001085b1;
        blank_attachment.dstColorBlendFactor = 0x150c9d;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x151375;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0xd;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&blank_attachment,&tess,alloc);
    }
    if ((uVar8 >> 0x20 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      uVar17 = pipe->pDepthStencilState->flags;
      blank_attachment._0_8_ = ZEXT48(uVar17);
      nexts.data_.s.str = (Ch *)0x405000000150be7;
      nexts.data_.n = (Number)0x5;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar17) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar17 = pipe->pDepthStencilState->stencilTestEnable;
      blank_attachment._0_8_ = ZEXT48(uVar17);
      nexts.data_.s.str = (Ch *)0x405000000150f94;
      nexts.data_.n = (Number)0x11;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar17) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pDepthStencilState->maxDepthBounds;
      nexts.data_.s.str = (Ch *)0x405000000150f85;
      nexts.data_.n = (Number)0xe;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      blank_attachment._0_8_ = (BADTYPE)pipe->pDepthStencilState->minDepthBounds;
      nexts.data_.s.str = (Ch *)0x405000000150f76;
      nexts.data_.n = (Number)0xe;
      blank_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      blank_attachment.colorBlendOp = 0x2160000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar17 = pipe->pDepthStencilState->depthBoundsTestEnable;
      blank_attachment._0_8_ = ZEXT48(uVar17);
      nexts.data_.s.str = (Ch *)0x405000000150f30;
      nexts.data_.n = (Number)0x15;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar17) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar17 = pipe->pDepthStencilState->depthWriteEnable;
      blank_attachment._0_8_ = ZEXT48(uVar17);
      nexts.data_.s.str = (Ch *)0x405000000150f65;
      nexts.data_.n = (Number)0x10;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar17) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      uVar17 = pipe->pDepthStencilState->depthTestEnable;
      blank_attachment._0_8_ = ZEXT48(uVar17);
      nexts.data_.s.str = (Ch *)0x405000000150f55;
      nexts.data_.n = (Number)0xf;
      blank_attachment._8_8_ = (ulong)(-1 < (int)uVar17) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&nexts,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&blank_attachment,alloc);
      local_a0.s = "depthCompareOp";
      local_a0.length = 0xe;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkCompareOp>(&tess,&local_a0,pipe->pDepthStencilState->depthCompareOp,alloc);
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x3000000000000;
      bindings.data_.n = (Number)0x0;
      bindings.data_.s.str = (Ch *)0x3000000000000;
      attrib.data_.n = (Number)alloc;
      json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::anon_class_8_1_a7a39255
      ::operator()((anon_class_8_1_a7a39255 *)&attrib,&sm,&pipe->pDepthStencilState->front);
      json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::anon_class_8_1_a7a39255
      ::operator()((anon_class_8_1_a7a39255 *)&attrib,&bindings,&pipe->pDepthStencilState->back);
      blank_attachment.dstColorBlendFactor = 0x150fa6;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 5;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,&sm,alloc);
      blank_attachment.dstColorBlendFactor = 0x150fe6;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 4;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,&bindings,alloc);
      pvVar3 = pipe->pDepthStencilState->pNext;
      if (pvVar3 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar7 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&nexts,&dynamic_info);
        if (!bVar7) goto LAB_001085b1;
        blank_attachment.dstColorBlendFactor = 0x150c9d;
        blank_attachment.colorBlendOp = 0x4050000;
        blank_attachment.blendEnable = 5;
        blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&blank_attachment,&nexts,alloc);
      }
      blank_attachment.dstColorBlendFactor = 0x151363;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x11;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&blank_attachment,&tess,alloc);
    }
    if ((GVar18._8_3_ >> 0x10 & 1) != 0) {
      nexts.data_.n = (Number)0x0;
      nexts.data_.s.str = (Ch *)0x0;
      bVar7 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pStages,pipe->stageCount,alloc,&nexts);
      if (!bVar7) goto LAB_001085b1;
      blank_attachment.dstColorBlendFactor = 0x1512e4;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 6;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&blank_attachment,&nexts,alloc);
    }
    if (pipe->pNext != (void *)0x0) {
      nexts.data_.n = (Number)0x0;
      nexts.data_.s.str = (Ch *)0x0;
      bVar7 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pNext,alloc,&nexts,&dynamic_info);
      if (!bVar7) goto LAB_001085b1;
      blank_attachment.dstColorBlendFactor = 0x150c9d;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 5;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&blank_attachment,&nexts,alloc);
    }
    bVar7 = true;
    if (&p != out_value) {
      (out_value->data_).n = p.data_.n;
      (out_value->data_).s.str = p.data_.s.str;
    }
  }
  else {
    tess.data_.n = (Number)0x0;
    tess.data_.s.str = (Ch *)0x3000000000000;
    uVar13 = pipe->pTessellationState->flags;
    blank_attachment._0_8_ = ZEXT48(uVar13);
    nexts.data_.s.str = (Ch *)0x405000000150be7;
    nexts.data_.n = (Number)0x5;
    blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&tess,&nexts,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&blank_attachment,alloc);
    uVar13 = pipe->pTessellationState->patchControlPoints;
    blank_attachment._0_8_ = ZEXT48(uVar13);
    nexts.data_.s.str = (Ch *)0x405000000151089;
    nexts.data_.n = (Number)0x12;
    blank_attachment._8_8_ = (ulong)(-1 < (int)uVar13) << 0x35 | 0x1d6000000000000;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&tess,&nexts,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&blank_attachment,alloc);
    pvVar3 = pipe->pTessellationState->pNext;
    if (pvVar3 == (void *)0x0) {
LAB_001060a6:
      blank_attachment.dstColorBlendFactor = 0x151341;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 0x11;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&p,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&blank_attachment,&tess,alloc);
      goto LAB_001060f1;
    }
    nexts.data_.n = (Number)0x0;
    nexts.data_.s.str = (Ch *)0x0;
    bVar7 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pvVar3,alloc,&nexts,&dynamic_info);
    if (bVar7) {
      blank_attachment.dstColorBlendFactor = 0x150c9d;
      blank_attachment.colorBlendOp = 0x4050000;
      blank_attachment.blendEnable = 5;
      blank_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&blank_attachment,&nexts,alloc);
      goto LAB_001060a6;
    }
LAB_001085b1:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

static bool json_value(const VkGraphicsPipelineCreateInfo &pipe,
                       const StateRecorder::SubpassMeta &subpass_meta,
                       Allocator &alloc, Value *out_value)
{
	Value p(kObjectType);
	p.AddMember("flags", pipe.flags, alloc);
	p.AddMember("basePipelineHandle", uint64_string(api_object_cast<uint64_t>(pipe.basePipelineHandle), alloc), alloc);
	p.AddMember("basePipelineIndex", pipe.basePipelineIndex, alloc);
	p.AddMember("layout", uint64_string(api_object_cast<uint64_t>(pipe.layout), alloc), alloc);
	p.AddMember("renderPass", uint64_string(api_object_cast<uint64_t>(pipe.renderPass), alloc), alloc);
	p.AddMember("subpass", pipe.subpass, alloc);

	DynamicStateInfo dynamic_info = {};
	if (pipe.pDynamicState)
		dynamic_info = Hashing::parse_dynamic_state_info(*pipe.pDynamicState);
	GlobalStateInfo global_info = Hashing::parse_global_state_info(pipe, dynamic_info, subpass_meta);

	if (global_info.tessellation_state)
	{
		Value tess(kObjectType);
		tess.AddMember("flags", pipe.pTessellationState->flags, alloc);
		tess.AddMember("patchControlPoints", pipe.pTessellationState->patchControlPoints, alloc);
		if (!pnext_chain_add_json_value(tess, *pipe.pTessellationState, alloc, &dynamic_info))
			return false;
		p.AddMember("tessellationState", tess, alloc);
	}

	if (pipe.pDynamicState)
	{
		Value dyn;
		if (!json_value(*pipe.pDynamicState, alloc, &dyn))
			return false;
		p.AddMember("dynamicState", dyn, alloc);
	}

	if (global_info.multisample_state)
	{
		Value ms(kObjectType);
		ms.AddMember("flags", pipe.pMultisampleState->flags, alloc);
		ms.AddMember("rasterizationSamples", pipe.pMultisampleState->rasterizationSamples, alloc);
		ms.AddMember("sampleShadingEnable", pipe.pMultisampleState->sampleShadingEnable, alloc);
		ms.AddMember("minSampleShading", pipe.pMultisampleState->minSampleShading, alloc);
		ms.AddMember("alphaToOneEnable", pipe.pMultisampleState->alphaToOneEnable, alloc);
		ms.AddMember("alphaToCoverageEnable", pipe.pMultisampleState->alphaToCoverageEnable, alloc);

		Value sm(kArrayType);
		if (pipe.pMultisampleState->pSampleMask)
		{
			auto entries = uint32_t(pipe.pMultisampleState->rasterizationSamples + 31) / 32;
			for (uint32_t i = 0; i < entries; i++)
				sm.PushBack(pipe.pMultisampleState->pSampleMask[i], alloc);
			ms.AddMember("sampleMask", sm, alloc);
		}

		if (!pnext_chain_add_json_value(ms, *pipe.pMultisampleState, alloc, &dynamic_info))
			return false;
		p.AddMember("multisampleState", ms, alloc);
	}

	if (global_info.vertex_input)
	{
		Value vi(kObjectType);

		Value attribs(kArrayType);
		Value bindings(kArrayType);
		vi.AddMember("flags", pipe.pVertexInputState->flags, alloc);

		for (uint32_t i = 0; i < pipe.pVertexInputState->vertexAttributeDescriptionCount; i++)
		{
			auto &a = pipe.pVertexInputState->pVertexAttributeDescriptions[i];
			Value attrib(kObjectType);
			attrib.AddMember("location", a.location, alloc);
			attrib.AddMember("binding", a.binding, alloc);
			attrib.AddMember("offset", a.offset, alloc);
			attrib.AddMember("format", a.format, alloc);
			attribs.PushBack(attrib, alloc);
		}

		for (uint32_t i = 0; i < pipe.pVertexInputState->vertexBindingDescriptionCount; i++)
		{
			auto &b = pipe.pVertexInputState->pVertexBindingDescriptions[i];
			Value binding(kObjectType);
			binding.AddMember("binding", b.binding, alloc);
			binding.AddMember("stride", b.stride, alloc);
			binding.AddMember("inputRate", b.inputRate, alloc);
			bindings.PushBack(binding, alloc);
		}
		vi.AddMember("attributes", attribs, alloc);
		vi.AddMember("bindings", bindings, alloc);
		if (!pnext_chain_add_json_value(vi, *pipe.pVertexInputState, alloc, &dynamic_info))
			return false;
		p.AddMember("vertexInputState", vi, alloc);
	}

	if (global_info.rasterization_state)
	{
		Value rs(kObjectType);
		rs.AddMember("flags", pipe.pRasterizationState->flags, alloc);
		rs.AddMember("depthBiasConstantFactor", pipe.pRasterizationState->depthBiasConstantFactor, alloc);
		rs.AddMember("depthBiasSlopeFactor", pipe.pRasterizationState->depthBiasSlopeFactor, alloc);
		rs.AddMember("depthBiasClamp", pipe.pRasterizationState->depthBiasClamp, alloc);
		rs.AddMember("depthBiasEnable", pipe.pRasterizationState->depthBiasEnable, alloc);
		rs.AddMember("depthClampEnable", pipe.pRasterizationState->depthClampEnable, alloc);
		rs.AddMember("polygonMode", pipe.pRasterizationState->polygonMode, alloc);
		rs.AddMember("rasterizerDiscardEnable", pipe.pRasterizationState->rasterizerDiscardEnable, alloc);
		rs.AddMember("frontFace", pipe.pRasterizationState->frontFace, alloc);
		rs.AddMember("lineWidth", pipe.pRasterizationState->lineWidth, alloc);
		rs.AddMember("cullMode", pipe.pRasterizationState->cullMode, alloc);
		if (!pnext_chain_add_json_value(rs, *pipe.pRasterizationState, alloc, &dynamic_info))
			return false;
		p.AddMember("rasterizationState", rs, alloc);
	}

	if (global_info.input_assembly)
	{
		Value ia(kObjectType);
		ia.AddMember("flags", pipe.pInputAssemblyState->flags, alloc);
		ia.AddMember("topology", pipe.pInputAssemblyState->topology, alloc);
		ia.AddMember("primitiveRestartEnable", pipe.pInputAssemblyState->primitiveRestartEnable, alloc);
		if (!pnext_chain_add_json_value(ia, *pipe.pInputAssemblyState, alloc, &dynamic_info))
			return false;
		p.AddMember("inputAssemblyState", ia, alloc);
	}

	if (global_info.color_blend_state)
	{
		Value cb(kObjectType);
		cb.AddMember("flags", pipe.pColorBlendState->flags, alloc);
		cb.AddMember("logicOp", pipe.pColorBlendState->logicOp, alloc);
		cb.AddMember("logicOpEnable", pipe.pColorBlendState->logicOpEnable, alloc);

		bool need_blend_constants = false;
		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		if (dynamic_attachments)
		{
			need_blend_constants = true;
		}
		else
		{
			for (uint32_t i = 0; i < pipe.pColorBlendState->attachmentCount; i++)
			{
				auto &a = pipe.pColorBlendState->pAttachments[i];

				if (a.blendEnable &&
				    (a.dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR))
				{
					need_blend_constants = true;
				}
			}
		}

		const VkPipelineColorBlendAttachmentState blank_attachment = {};

		Value blend_constants(kArrayType);
		for (auto &c : pipe.pColorBlendState->blendConstants)
			blend_constants.PushBack(dynamic_info.blend_constants || !need_blend_constants ? 0.0f : c, alloc);
		cb.AddMember("blendConstants", blend_constants, alloc);
		Value attachments(kArrayType);
		for (uint32_t i = 0; i < pipe.pColorBlendState->attachmentCount; i++)
		{
			// We cannot completely decouple pAttachments from attachmentCount.
			// Just serialize dummy entries.

			auto &a = dynamic_attachments ? blank_attachment : pipe.pColorBlendState->pAttachments[i];
			Value att(kObjectType);
			att.AddMember("dstAlphaBlendFactor", a.dstAlphaBlendFactor, alloc);
			att.AddMember("srcAlphaBlendFactor", a.srcAlphaBlendFactor, alloc);
			att.AddMember("dstColorBlendFactor", a.dstColorBlendFactor, alloc);
			att.AddMember("srcColorBlendFactor", a.srcColorBlendFactor, alloc);
			att.AddMember("colorWriteMask", a.colorWriteMask, alloc);
			att.AddMember("alphaBlendOp", a.alphaBlendOp, alloc);
			att.AddMember("colorBlendOp", a.colorBlendOp, alloc);
			att.AddMember("blendEnable", a.blendEnable, alloc);
			attachments.PushBack(att, alloc);
		}
		cb.AddMember("attachments", attachments, alloc);
		if (!pnext_chain_add_json_value(cb, *pipe.pColorBlendState, alloc, &dynamic_info))
			return false;
		p.AddMember("colorBlendState", cb, alloc);
	}

	if (global_info.viewport_state)
	{
		Value vp(kObjectType);
		vp.AddMember("flags", pipe.pViewportState->flags, alloc);
		vp.AddMember("viewportCount", pipe.pViewportState->viewportCount, alloc);
		vp.AddMember("scissorCount", pipe.pViewportState->scissorCount, alloc);
		if (pipe.pViewportState->pViewports)
		{
			Value viewports(kArrayType);
			for (uint32_t i = 0; i < pipe.pViewportState->viewportCount; i++)
			{
				Value viewport(kObjectType);
				viewport.AddMember("x", pipe.pViewportState->pViewports[i].x, alloc);
				viewport.AddMember("y", pipe.pViewportState->pViewports[i].y, alloc);
				viewport.AddMember("width", pipe.pViewportState->pViewports[i].width, alloc);
				viewport.AddMember("height", pipe.pViewportState->pViewports[i].height, alloc);
				viewport.AddMember("minDepth", pipe.pViewportState->pViewports[i].minDepth, alloc);
				viewport.AddMember("maxDepth", pipe.pViewportState->pViewports[i].maxDepth, alloc);
				viewports.PushBack(viewport, alloc);
			}
			vp.AddMember("viewports", viewports, alloc);
		}

		if (pipe.pViewportState->pScissors)
		{
			Value scissors(kArrayType);
			for (uint32_t i = 0; i < pipe.pViewportState->scissorCount; i++)
			{
				Value scissor(kObjectType);
				scissor.AddMember("x", pipe.pViewportState->pScissors[i].offset.x, alloc);
				scissor.AddMember("y", pipe.pViewportState->pScissors[i].offset.y, alloc);
				scissor.AddMember("width", pipe.pViewportState->pScissors[i].extent.width, alloc);
				scissor.AddMember("height", pipe.pViewportState->pScissors[i].extent.height, alloc);
				scissors.PushBack(scissor, alloc);
			}
			vp.AddMember("scissors", scissors, alloc);
		}
		if (!pnext_chain_add_json_value(vp, *pipe.pViewportState, alloc, &dynamic_info))
			return false;
		p.AddMember("viewportState", vp, alloc);
	}

	if (global_info.depth_stencil_state)
	{
		Value ds(kObjectType);
		ds.AddMember("flags", pipe.pDepthStencilState->flags, alloc);
		ds.AddMember("stencilTestEnable", pipe.pDepthStencilState->stencilTestEnable, alloc);
		ds.AddMember("maxDepthBounds", pipe.pDepthStencilState->maxDepthBounds, alloc);
		ds.AddMember("minDepthBounds", pipe.pDepthStencilState->minDepthBounds, alloc);
		ds.AddMember("depthBoundsTestEnable", pipe.pDepthStencilState->depthBoundsTestEnable, alloc);
		ds.AddMember("depthWriteEnable", pipe.pDepthStencilState->depthWriteEnable, alloc);
		ds.AddMember("depthTestEnable", pipe.pDepthStencilState->depthTestEnable, alloc);
		ds.AddMember("depthCompareOp", pipe.pDepthStencilState->depthCompareOp, alloc);

		const auto serialize_stencil = [&](Value &v, const VkStencilOpState &state) {
			v.AddMember("compareOp", state.compareOp, alloc);
			v.AddMember("writeMask", state.writeMask, alloc);
			v.AddMember("reference", state.reference, alloc);
			v.AddMember("compareMask", state.compareMask, alloc);
			v.AddMember("passOp", state.passOp, alloc);
			v.AddMember("failOp", state.failOp, alloc);
			v.AddMember("depthFailOp", state.depthFailOp, alloc);
		};
		Value front(kObjectType);
		Value back(kObjectType);
		serialize_stencil(front, pipe.pDepthStencilState->front);
		serialize_stencil(back, pipe.pDepthStencilState->back);
		ds.AddMember("front", front, alloc);
		ds.AddMember("back", back, alloc);
		if (!pnext_chain_add_json_value(ds, *pipe.pDepthStencilState, alloc, &dynamic_info))
			return false;
		p.AddMember("depthStencilState", ds, alloc);
	}

	if (global_info.module_state)
	{
		Value stages;
		if (!json_value(pipe.pStages, pipe.stageCount, alloc, &stages))
			return false;
		p.AddMember("stages", stages, alloc);
	}

	if (!pnext_chain_add_json_value(p, pipe, alloc, &dynamic_info))
		return false;

	*out_value = p;
	return true;
}